

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

void rewind_coloring(saucy *s,coloring *c,int lev)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  
  iVar1 = s->splitlev[lev];
  lVar11 = (long)s->nsplits;
  if (iVar1 < s->nsplits) {
    piVar6 = s->splitwho;
    piVar7 = s->splitfrom;
    piVar8 = c->clen;
    do {
      iVar2 = piVar7[lVar11 + -1];
      iVar3 = piVar6[lVar11 + -1];
      iVar4 = piVar8[iVar3];
      iVar5 = piVar8[iVar2];
      piVar8[iVar2] = iVar4 + iVar5 + 1;
      if (iVar3 <= iVar4 + iVar5 + iVar2 + 1) {
        piVar9 = c->cfront;
        piVar10 = c->lab;
        lVar12 = 0;
        do {
          piVar9[piVar10[iVar3 + lVar12]] = iVar2;
          lVar12 = lVar12 + 1;
        } while (((iVar4 + iVar2 + iVar5) - iVar3) + 2 != (int)lVar12);
      }
      lVar11 = lVar11 + -1;
    } while (iVar1 < lVar11);
  }
  return;
}

Assistant:

static void
rewind_coloring(struct saucy *s, struct coloring *c, int lev)
{
    int i, cf, ff, splits = s->splitlev[lev];
    for (i = s->nsplits - 1; i >= splits; --i) {
        cf = s->splitfrom[i];
        ff = s->splitwho[i];
        c->clen[cf] += c->clen[ff] + 1;
        fix_fronts(c, cf, ff);
    }
}